

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O3

string * __thiscall
helics::TimeCoordinator::printTimeStatus_abi_cxx11_
          (string *__return_storage_ptr__,TimeCoordinator *this)

{
  long lVar1;
  long lVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  format_args args;
  double local_88 [2];
  double local_78;
  double local_68;
  double local_58;
  double local_48;
  double local_38;
  double local_28;
  double local_18;
  
  lVar1 = (this->time_granted).internalTimeCode;
  lVar2 = (this->time_requested).internalTimeCode;
  local_88[0] = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
  lVar1 = (this->time_exec).internalTimeCode;
  local_78 = (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
  lVar2 = (this->time_allow).internalTimeCode;
  local_68 = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
  local_58 = (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
  lVar1 = (this->time_value).internalTimeCode;
  local_48 = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
  lVar1 = (this->time_message).internalTimeCode;
  lVar2 = (this->time_minDe).internalTimeCode;
  local_38 = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
  lVar1 = (this->time_minminDe).internalTimeCode;
  local_28 = (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
  local_18 = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
  fmt.size_ = 0xaaaaaaaa;
  fmt.data_ = (char *)0x75;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_88;
  ::fmt::v11::vformat_abi_cxx11_
            (__return_storage_ptr__,
             (v11 *)
             "{{\"granted_time\":{},\"requested_time\":{}, \"exec\":{}, \"allow\":{}, \"value\":{}, \"message\":{}, \"minDe\":{}, \"minminDe\":{}}}"
             ,fmt,args);
  return __return_storage_ptr__;
}

Assistant:

std::string TimeCoordinator::printTimeStatus() const
{
    return fmt::format(
        R"raw({{"granted_time":{},"requested_time":{}, "exec":{}, "allow":{}, "value":{}, "message":{}, "minDe":{}, "minminDe":{}}})raw",
        static_cast<double>(time_granted),
        static_cast<double>(time_requested),
        static_cast<double>(time_exec),
        static_cast<double>(time_allow),
        static_cast<double>(time_value),
        static_cast<double>(time_message),
        static_cast<double>(time_minDe),
        static_cast<double>(time_minminDe));
}